

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerRewriting.cpp
# Opt level: O2

bool __thiscall
Inferences::InnerRewriting::perform
          (InnerRewriting *this,Clause *cl,Clause **replacement,ClauseIterator *premises)

{
  Ordering *ord;
  Literal *eq;
  bool bVar1;
  Literal *lit;
  Literal *pLVar2;
  Clause *pCVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  TermList rhs;
  TermList lhs;
  RStack<Literal_*> resLits;
  SimplifyingInference1 local_70;
  Inference local_60;
  
  ord = (((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->_ordering)._obj;
  uVar6 = (ulong)((uint)*(undefined8 *)&cl->field_0x38 & 0xfffff);
  for (uVar4 = 0; uVar4 != uVar6; uVar4 = uVar4 + 1) {
    eq = cl->_literals[uVar4];
    lhs._content = 2;
    rhs._content = 2;
    if (((eq->super_Term)._functor == 0) && (((eq->super_Term)._args[0]._content & 4) == 0)) {
      bVar1 = Kernel::EqHelper::hasGreaterEqualitySide(eq,ord,&lhs,&rhs);
      if (bVar1) {
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          if (uVar4 != uVar7) {
            pLVar2 = cl->_literals[uVar7];
            lit = Kernel::EqHelper::replace(pLVar2,lhs,rhs);
            if (lit != pLVar2) {
              bVar1 = Kernel::EqHelper::isEqTautology(lit);
              if (bVar1) {
                *(int *)(DAT_00a141a0 + 0x1a4) = *(int *)(DAT_00a141a0 + 0x1a4) + 1;
                goto LAB_0040516e;
              }
              Lib::
              Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              Recycled(&resLits);
              uVar5 = 0;
              goto LAB_004050a8;
            }
          }
        }
      }
    }
  }
  goto LAB_0040516e;
LAB_004050a8:
  if (uVar6 == uVar5) goto LAB_0040511f;
  if (uVar4 == uVar5) {
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               resLits._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,eq);
  }
  else {
    if (uVar5 < uVar7) {
      pLVar2 = cl->_literals[uVar5];
    }
    else {
      pLVar2 = lit;
      if (uVar5 != uVar7) {
        pLVar2 = Kernel::EqHelper::replace(cl->_literals[uVar5],lhs,rhs);
        bVar1 = Kernel::EqHelper::isEqTautology(pLVar2);
        if (!bVar1) {
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)
                     resLits._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                     pLVar2);
          goto LAB_0040511a;
        }
        *(int *)(DAT_00a141a0 + 0x1a4) = *(int *)(DAT_00a141a0 + 0x1a4) + 1;
        goto LAB_00405164;
      }
    }
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               resLits._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,pLVar2);
  }
LAB_0040511a:
  uVar5 = uVar5 + 1;
  goto LAB_004050a8;
LAB_0040511f:
  *(int *)(DAT_00a141a0 + 0x1a0) = *(int *)(DAT_00a141a0 + 0x1a0) + 1;
  local_70.rule = INNER_REWRITING;
  local_70.premise = cl;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar3 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      resLits._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_60);
  *replacement = pCVar3;
LAB_00405164:
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&resLits);
LAB_0040516e:
  return uVar4 < uVar6;
}

Assistant:

bool InnerRewriting::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  Ordering& ordering = _salg->getOrdering();

  // look for the first equality which rewrites something and rewrite everything with it (check for EqTaut as you go)
  unsigned len = cl->length();
  for (unsigned i = 0; i < len; i++) {
    Literal* rwLit=(*cl)[i];
    TermList lhs, rhs;
    if (rwLit->isEquality() && rwLit->isNegative() && EqHelper::hasGreaterEqualitySide(rwLit,ordering,lhs,rhs)) {
      for (unsigned j = 0; j < len; j++) {
        if (i != j) {
          Literal* lit = (*cl)[j];
          Literal* nLit = EqHelper::replace(lit,lhs,rhs);
          if (nLit != lit) {
            if(EqHelper::isEqTautology(nLit)) {
              env.statistics->innerRewritesToEqTaut++;
              return true;
            }

            RStack<Literal*> resLits;

            for (unsigned k = 0; k < len; k++) {
              if (k == i) {
                resLits->push(rwLit);
              } else if (k < j) {
                resLits->push((*cl)[k]);
              } else if (k == j) {
                resLits->push(nLit);
              } else {
                Literal* oLit = (*cl)[k];
                Literal* rLit = EqHelper::replace(oLit,lhs,rhs);
                if(EqHelper::isEqTautology(rLit)) {
                  env.statistics->innerRewritesToEqTaut++;
                  return true;
                }
                resLits->push(rLit);
              }
            }

            env.statistics->innerRewrites++;

            replacement = Clause::fromStack(*resLits,SimplifyingInference1(InferenceRule::INNER_REWRITING, cl));
            return true;
          }
        }
      }
    }
  }

  return false;
}